

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTools.h
# Opt level: O0

bool containsLinkedToken(vector<LinkedToken,_std::allocator<LinkedToken>_> *linkedTokens,
                        LinkedToken *linkedTokenToFind)

{
  LinkedToken *this;
  bool bVar1;
  IResultCapture *pIVar2;
  MessageBuilder *pMVar3;
  __normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
  local_1f0;
  LinkedToken *local_1e8;
  LinkedToken *local_1e0;
  __normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
  local_1d8;
  __normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
  local_1d0;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  SourceLineInfo local_188;
  StringRef local_178;
  MessageBuilder local_168;
  reference local_108;
  LinkedToken *lt;
  const_iterator __end1;
  const_iterator __begin1;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *__range1;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  SourceLineInfo local_98;
  StringRef local_88;
  MessageBuilder local_78;
  anon_class_8_1_3d9327f4_for__M_pred local_18;
  LinkedToken *linkedTokenToFind_local;
  vector<LinkedToken,_std::allocator<LinkedToken>_> *linkedTokens_local;
  
  local_18.linkedTokenToFind = linkedTokenToFind;
  linkedTokenToFind_local = (LinkedToken *)linkedTokens;
  pIVar2 = Catch::getResultCapture();
  local_88 = operator____catch_sr("UNSCOPED_INFO",0xd);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/test/TestTools.h"
             ,0x3a);
  Catch::MessageBuilder::MessageBuilder(&local_78,&local_88,&local_98,Info);
  LinkedToken::toLink_abi_cxx11_(&local_d8,local_18.linkedTokenToFind);
  std::operator+(&local_b8,"ToFind: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  pMVar3 = Catch::MessageBuilder::operator<<(&local_78,&local_b8);
  (*pIVar2->_vptr_IResultCapture[8])(pIVar2,pMVar3);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  Catch::MessageBuilder::~MessageBuilder(&local_78);
  this = linkedTokenToFind_local;
  __end1 = std::vector<LinkedToken,_std::allocator<LinkedToken>_>::begin(linkedTokenToFind_local);
  lt = (LinkedToken *)
       std::vector<LinkedToken,_std::allocator<LinkedToken>_>::end
                 ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
                                *)&lt);
    if (!bVar1) break;
    local_108 = __gnu_cxx::
                __normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
                ::operator*(&__end1);
    pIVar2 = Catch::getResultCapture();
    local_178 = operator____catch_sr("UNSCOPED_INFO",0xd);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/test/TestTools.h"
               ,0x3c);
    Catch::MessageBuilder::MessageBuilder(&local_168,&local_178,&local_188,Info);
    LinkedToken::toLink_abi_cxx11_(&local_1c8,local_108);
    std::operator+(&local_1a8,"In list: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8);
    pMVar3 = Catch::MessageBuilder::operator<<(&local_168,&local_1a8);
    (*pIVar2->_vptr_IResultCapture[8])(pIVar2,pMVar3);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    Catch::MessageBuilder::~MessageBuilder(&local_168);
    __gnu_cxx::
    __normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
    ::operator++(&__end1);
  }
  local_1d8._M_current =
       (LinkedToken *)
       std::vector<LinkedToken,_std::allocator<LinkedToken>_>::begin(linkedTokenToFind_local);
  local_1e0 = (LinkedToken *)
              std::vector<LinkedToken,_std::allocator<LinkedToken>_>::end
                        ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)
                         linkedTokenToFind_local);
  local_1e8 = local_18.linkedTokenToFind;
  local_1d0 = std::
              find_if<__gnu_cxx::__normal_iterator<LinkedToken_const*,std::vector<LinkedToken,std::allocator<LinkedToken>>>,containsLinkedToken(std::vector<LinkedToken,std::allocator<LinkedToken>>const&,LinkedToken_const&)::_lambda(LinkedToken_const&)_1_>
                        (local_1d8,
                         (__normal_iterator<const_LinkedToken_*,_std::vector<LinkedToken,_std::allocator<LinkedToken>_>_>
                          )local_1e0,local_18);
  local_1f0._M_current =
       (LinkedToken *)
       std::vector<LinkedToken,_std::allocator<LinkedToken>_>::end(linkedTokenToFind_local);
  bVar1 = __gnu_cxx::operator!=(&local_1d0,&local_1f0);
  return bVar1;
}

Assistant:

inline bool containsLinkedToken(const std::vector<LinkedToken>& linkedTokens, const LinkedToken& linkedTokenToFind) {
    UNSCOPED_INFO("ToFind: " + linkedTokenToFind.toLink());
    for (const LinkedToken& lt : linkedTokens) {
        UNSCOPED_INFO("In list: " + lt.toLink());
    }

    return std::find_if(linkedTokens.begin(), linkedTokens.end(), [&](const LinkedToken& t) {
        return (t.token.content == linkedTokenToFind.token.content) and (t.token.type == linkedTokenToFind.token.type) and (t.link == linkedTokenToFind.link);
    }) != linkedTokens.end();
}